

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
::reactive_socket_send_op
          (reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,const_buffers_1 *buffers
          ,message_flags flags,function<void_(const_std::error_code_&,_unsigned_long)> *handler,
          any_io_executor *io_ex)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  reactive_socket_send_op_base<asio::const_buffers_1> *in_RSI;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  func_type unaff_retaddr;
  code *__x;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe8;
  
  __x = do_complete;
  reactive_socket_send_op_base<asio::const_buffers_1>::reactive_socket_send_op_base
            (in_RSI,(error_code *)CONCAT44(in_EDX,CONCAT13(in_CL,in_stack_ffffffffffffffe8)),
             (socket_type)((ulong)in_R8 >> 0x20),(state_type)((ulong)in_R8 >> 0x18),
             (const_buffers_1 *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
             (message_flags)((ulong)in_RDI >> 0x20),unaff_retaddr);
  std::function<void_(const_std::error_code_&,_unsigned_long)>::function
            (in_RDI,(function<void_(const_std::error_code_&,_unsigned_long)> *)__x);
  handler_work<std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor,_void>
  ::handler_work((handler_work<std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor,_void>
                  *)in_RDI,(function<void_(const_std::error_code_&,_unsigned_long)> *)__x,
                 (any_io_executor *)0x774c10);
  return;
}

Assistant:

reactive_socket_send_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const ConstBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_send_op_base<ConstBufferSequence>(success_ec, socket,
        state, buffers, flags, &reactive_socket_send_op::do_complete),
      handler_(static_cast<Handler&&>(handler)),
      work_(handler_, io_ex)
  {
  }